

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O0

bool __thiscall FirewirePort::Init(FirewirePort *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  uint uVar4;
  raw1394handle_t prVar5;
  ostream *poVar6;
  reference ppFVar7;
  bus_reset_handler_t p_Var8;
  void *pvVar9;
  ulong uVar10;
  char *pcVar11;
  int local_5c;
  bool ret;
  int i;
  raw1394_portinfo *pinfo;
  FirewirePort *pFStack_48;
  int nports;
  FirewirePort **local_40;
  __normal_iterator<FirewirePort_**,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
  local_38;
  __normal_iterator<FirewirePort_**,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
  local_30;
  FirewirePort **local_28;
  __normal_iterator<FirewirePort_*const_*,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
  local_20;
  const_iterator it;
  FirewirePort *this_local;
  
  it._M_current = (FirewirePort **)this;
  prVar5 = (raw1394handle_t)raw1394_new_handle();
  this->handle = prVar5;
  if (this->handle == (raw1394handle_t)0x0) {
    poVar6 = std::operator<<((this->super_BasePort).outStr,
                             "FirewirePort::Init: error, could not create handle");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    __gnu_cxx::
    __normal_iterator<FirewirePort_*const_*,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
    ::__normal_iterator(&local_20);
    local_30._M_current =
         (FirewirePort **)
         std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>::begin(&PortList);
    __gnu_cxx::
    __normal_iterator<FirewirePort*const*,std::vector<FirewirePort*,std::allocator<FirewirePort*>>>
    ::__normal_iterator<FirewirePort**>
              ((__normal_iterator<FirewirePort*const*,std::vector<FirewirePort*,std::allocator<FirewirePort*>>>
                *)&local_28,&local_30);
    local_20._M_current = local_28;
    while( true ) {
      local_38._M_current =
           (FirewirePort **)
           std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>::end(&PortList);
      bVar2 = __gnu_cxx::operator!=(&local_20,&local_38);
      if (!bVar2) break;
      ppFVar7 = __gnu_cxx::
                __normal_iterator<FirewirePort_*const_*,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
                ::operator*(&local_20);
      if (((*ppFVar7)->super_BasePort).PortNum == (this->super_BasePort).PortNum) {
        poVar6 = std::operator<<((this->super_BasePort).outStr,"FirewirePort::Init: warning, port ")
        ;
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,(this->super_BasePort).PortNum);
        poVar6 = std::operator<<(poVar6," is already used (be careful about thread safety)");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      ppFVar7 = __gnu_cxx::
                __normal_iterator<FirewirePort_*const_*,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
                ::operator*(&local_20);
      if ((*ppFVar7)->handle == this->handle) {
        poVar6 = std::operator<<((this->super_BasePort).outStr,
                                 "FirewirePort::Init: warning, handle is already used");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      local_40 = (FirewirePort **)
                 __gnu_cxx::
                 __normal_iterator<FirewirePort_*const_*,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
                 ::operator++(&local_20,0);
    }
    pFStack_48 = this;
    std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>::push_back
              (&PortList,&stack0xffffffffffffffb8);
    memset((this->super_BasePort).Node2Board,0x10,0x40);
    p_Var8 = (bus_reset_handler_t)raw1394_set_bus_reset_handler(this->handle,reset_handler);
    this->old_reset_handler = p_Var8;
    iVar3 = raw1394_get_port_info(this->handle,0,0);
    poVar6 = std::operator<<((this->super_BasePort).outStr,"FirewirePort::Init: number of ports = ")
    ;
    pvVar9 = (void *)std::ostream::operator<<(poVar6,iVar3);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    if (0 < iVar3) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)iVar3;
      uVar10 = SUB168(auVar1 * ZEXT816(0x24),0);
      if (SUB168(auVar1 * ZEXT816(0x24),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      pvVar9 = operator_new__(uVar10);
      raw1394_get_port_info(this->handle,pvVar9,iVar3);
      for (local_5c = 0; local_5c < iVar3; local_5c = local_5c + 1) {
        poVar6 = std::operator<<((this->super_BasePort).outStr,"  Port ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_5c);
        poVar6 = std::operator<<(poVar6,": ");
        poVar6 = std::operator<<(poVar6,(char *)((long)pvVar9 + (long)local_5c * 0x24 + 4));
        poVar6 = std::operator<<(poVar6,", ");
        poVar6 = (ostream *)
                 std::ostream::operator<<(poVar6,*(int *)((long)pvVar9 + (long)local_5c * 0x24));
        poVar6 = std::operator<<(poVar6," nodes");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
    }
    if (iVar3 < (this->super_BasePort).PortNum) {
      poVar6 = std::operator<<((this->super_BasePort).outStr,"FirewirePort::Init: port ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(this->super_BasePort).PortNum);
      poVar6 = std::operator<<(poVar6," does not exist");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      raw1394_destroy_handle(this->handle);
      this->handle = (raw1394handle_t)0x0;
      this_local._7_1_ = false;
    }
    else {
      iVar3 = raw1394_set_port(this->handle,(this->super_BasePort).PortNum);
      if (iVar3 == 0) {
        poVar6 = std::operator<<((this->super_BasePort).outStr,
                                 "FirewirePort::Init: successfully initialized port ");
        pvVar9 = (void *)std::ostream::operator<<(poVar6,(this->super_BasePort).PortNum);
        std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<((this->super_BasePort).outStr,"Using libraw1394 version ");
        pcVar11 = (char *)raw1394_get_libversion();
        poVar6 = std::operator<<(poVar6,pcVar11);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        StopCycleStartPacket(this);
        uVar4 = (*(this->super_BasePort)._vptr_BasePort[3])();
        this_local._7_1_ = (bool)((byte)uVar4 & 1);
        if ((uVar4 & 1) != 0) {
          BasePort::SetDefaultProtocol(&this->super_BasePort);
        }
      }
      else {
        poVar6 = std::operator<<((this->super_BasePort).outStr,
                                 "FirewirePort::Init: error setting port to ");
        pvVar9 = (void *)std::ostream::operator<<(poVar6,(this->super_BasePort).PortNum);
        std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
        raw1394_destroy_handle(this->handle);
        this->handle = (raw1394handle_t)0x0;
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FirewirePort::Init(void)
{
    // create firewire port handle
    handle = raw1394_new_handle();
    if (!handle) {
        outStr << "FirewirePort::Init: error, could not create handle" << std::endl;
        return false;
    }

    PortListType::const_iterator it;
    for (it = PortList.begin(); it != PortList.end(); it++) {
        if ((*it)->PortNum == PortNum)
            outStr << "FirewirePort::Init: warning, port " << PortNum
                   << " is already used (be careful about thread safety)" << std::endl;
        if ((*it)->handle == handle) // should never happen
            outStr << "FirewirePort::Init: warning, handle is already used" << std::endl;
    }
    PortList.push_back(this);

    memset(Node2Board, BoardIO::MAX_BOARDS, sizeof(Node2Board));

    // set the bus reset handler
    old_reset_handler = raw1394_set_bus_reset_handler(handle, reset_handler);

    // get number of ports
    int nports = raw1394_get_port_info(handle, NULL, 0);
    outStr << "FirewirePort::Init: number of ports = " << nports << std::endl;
    if (nports > 0) {
        struct raw1394_portinfo *pinfo = new raw1394_portinfo[nports];
        raw1394_get_port_info(handle, pinfo, nports);
        for (int i = 0; i < nports; i++)
            outStr << "  Port " << i << ": " << pinfo[i].name << ", " << pinfo[i].nodes << " nodes" << std::endl;
        delete [] pinfo;
    }
    if (nports < PortNum) {
        outStr << "FirewirePort::Init: port " << PortNum << " does not exist" << std::endl;
        raw1394_destroy_handle(handle);
        handle = NULL;
        return false;
    }

    if (raw1394_set_port(handle, PortNum)) {
        outStr << "FirewirePort::Init: error setting port to " << PortNum << std::endl;
        raw1394_destroy_handle(handle);
        handle = NULL;
        return false;
    }
    outStr << "FirewirePort::Init: successfully initialized port " << PortNum << std::endl;
    outStr << "Using libraw1394 version " << raw1394_get_libversion() << std::endl;

    // stop cycle start packet
    StopCycleStartPacket();

    bool ret = ScanNodes();
    if (ret)
        SetDefaultProtocol();
    return ret;
}